

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_value_compare(ly_ctx *ctx1,char *value1,void *val_prefix_data1,ly_ctx *ctx2,
                          char *value2,void *val_prefix_data2)

{
  int iVar1;
  LY_ERR local_84;
  lys_module *plStack_80;
  LY_ERR ret;
  lys_module *mod2;
  lys_module *mod1;
  uint local_68;
  ly_bool is_prefix2;
  uint uStack_64;
  ly_bool is_prefix1;
  uint32_t value2_len;
  uint32_t value1_len;
  char *value2_next;
  char *value1_next;
  char *value2_iter;
  char *value1_iter;
  void *val_prefix_data2_local;
  char *value2_local;
  ly_ctx *ctx2_local;
  void *val_prefix_data1_local;
  char *value1_local;
  ly_ctx *ctx1_local;
  
  if ((value1 == (char *)0x0) && (value2 == (char *)0x0)) {
    ctx1_local._4_4_ = LY_SUCCESS;
  }
  else {
    if (((value1 == (char *)0x0) || (value2 != (char *)0x0)) &&
       ((value1 != (char *)0x0 || (value2 == (char *)0x0)))) {
      value2_local = (char *)ctx2;
      if (ctx2 == (ly_ctx *)0x0) {
        value2_local = (char *)ctx1;
      }
      local_84 = LY_SUCCESS;
      value1_next = value2;
      value2_iter = value1;
      value1_iter = (char *)val_prefix_data2;
      val_prefix_data2_local = value2;
      ctx2_local = (ly_ctx *)val_prefix_data1;
      val_prefix_data1_local = value1;
      value1_local = (char *)ctx1;
      while( true ) {
        if (((value2_iter == (char *)0x0 || value1_next == (char *)0x0) ||
            (local_84 = ly_value_prefix_next
                                  (value2_iter,(char *)0x0,&stack0xffffffffffffff9c,
                                   (ly_bool *)((long)&mod1 + 7),&value2_next),
            local_84 != LY_SUCCESS)) ||
           (local_84 = ly_value_prefix_next
                                 (value1_next,(char *)0x0,&local_68,(ly_bool *)((long)&mod1 + 6),
                                  (char **)&value2_len), local_84 != LY_SUCCESS)) goto LAB_0020f482;
        if (mod1._7_1_ != mod1._6_1_) break;
        if (mod1._7_1_ == '\0') {
          if (uStack_64 != local_68) {
            local_84 = LY_ENOT;
            goto LAB_0020f482;
          }
          iVar1 = strncmp(value2_iter,value1_next,(ulong)uStack_64);
          if (iVar1 != 0) {
            local_84 = LY_ENOT;
            goto LAB_0020f482;
          }
        }
        else {
          plStack_80 = (lys_module *)0x0;
          mod2 = (lys_module *)0x0;
          if (ctx2_local != (ly_ctx *)0x0) {
            mod2 = ly_resolve_prefix((ly_ctx *)value1_local,value2_iter,(ulong)uStack_64,
                                     LY_VALUE_XML,ctx2_local);
          }
          if (value1_iter != (char *)0x0) {
            plStack_80 = ly_resolve_prefix((ly_ctx *)value2_local,value1_next,(ulong)local_68,
                                           LY_VALUE_XML,value1_iter);
          }
          if ((mod2 == (lys_module *)0x0) || (plStack_80 == (lys_module *)0x0)) {
            local_84 = LY_ENOT;
LAB_0020f482:
            if ((value2_iter != (char *)0x0) || (value1_next != (char *)0x0)) {
              local_84 = LY_ENOT;
            }
            return local_84;
          }
          if (mod2->ctx == plStack_80->ctx) {
            if ((mod2->name != plStack_80->name) || (mod2->revision != plStack_80->revision)) {
              local_84 = LY_ENOT;
              goto LAB_0020f482;
            }
          }
          else {
            iVar1 = strcmp(mod2->name,plStack_80->name);
            if (iVar1 != 0) {
              local_84 = LY_ENOT;
              goto LAB_0020f482;
            }
            if ((mod2->revision != (char *)0x0) || (plStack_80->revision != (char *)0x0)) {
              if ((mod2->revision == (char *)0x0) || (plStack_80->revision == (char *)0x0)) {
                local_84 = LY_ENOT;
                goto LAB_0020f482;
              }
              iVar1 = strcmp(mod2->revision,plStack_80->revision);
              if (iVar1 != 0) {
                local_84 = LY_ENOT;
                goto LAB_0020f482;
              }
            }
          }
        }
        value2_iter = value2_next;
        value1_next = _value2_len;
      }
      local_84 = LY_ENOT;
      goto LAB_0020f482;
    }
    ctx1_local._4_4_ = LY_ENOT;
  }
  return ctx1_local._4_4_;
}

Assistant:

LY_ERR
lyxml_value_compare(const struct ly_ctx *ctx1, const char *value1, void *val_prefix_data1,
        const struct ly_ctx *ctx2, const char *value2, void *val_prefix_data2)
{
    const char *value1_iter, *value2_iter;
    const char *value1_next, *value2_next;
    uint32_t value1_len, value2_len;
    ly_bool is_prefix1, is_prefix2;
    const struct lys_module *mod1, *mod2;
    LY_ERR ret;

    if (!value1 && !value2) {
        return LY_SUCCESS;
    }
    if ((value1 && !value2) || (!value1 && value2)) {
        return LY_ENOT;
    }

    if (!ctx2) {
        ctx2 = ctx1;
    }

    ret = LY_SUCCESS;
    for (value1_iter = value1, value2_iter = value2;
            value1_iter && value2_iter;
            value1_iter = value1_next, value2_iter = value2_next) {
        if ((ret = ly_value_prefix_next(value1_iter, NULL, &value1_len, &is_prefix1, &value1_next))) {
            break;
        }
        if ((ret = ly_value_prefix_next(value2_iter, NULL, &value2_len, &is_prefix2, &value2_next))) {
            break;
        }

        if (is_prefix1 != is_prefix2) {
            ret = LY_ENOT;
            break;
        }

        if (!is_prefix1) {
            if (value1_len != value2_len) {
                ret = LY_ENOT;
                break;
            }
            if (strncmp(value1_iter, value2_iter, value1_len)) {
                ret = LY_ENOT;
                break;
            }
            continue;
        }

        mod1 = mod2 = NULL;
        if (val_prefix_data1) {
            /* find module of the first prefix, if any */
            mod1 = ly_resolve_prefix(ctx1, value1_iter, value1_len, LY_VALUE_XML, val_prefix_data1);
        }
        if (val_prefix_data2) {
            mod2 = ly_resolve_prefix(ctx2, value2_iter, value2_len, LY_VALUE_XML, val_prefix_data2);
        }
        if (!mod1 || !mod2) {
            /* not a prefix or maps to different namespaces */
            ret = LY_ENOT;
            break;
        }

        if (mod1->ctx == mod2->ctx) {
            /* same contexts */
            if ((mod1->name != mod2->name) || (mod1->revision != mod2->revision)) {
                ret = LY_ENOT;
                break;
            }
        } else {
            /* different contexts */
            if (strcmp(mod1->name, mod2->name)) {
                ret = LY_ENOT;
                break;
            }

            if (mod1->revision || mod2->revision) {
                if (!mod1->revision || !mod2->revision) {
                    ret = LY_ENOT;
                    break;
                }
                if (strcmp(mod1->revision, mod2->revision)) {
                    ret = LY_ENOT;
                    break;
                }
            }
        }
    }

    if (value1_iter || value2_iter) {
        ret = LY_ENOT;
    }

    return ret;
}